

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O2

void __thiscall
Fluid::draw_particles_ssf
          (Fluid *this,RenderTexture *scene_texture,mat4 *projection,mat4 *view,vec4 *viewport)

{
  PFNGLUNIFORM1IPROC p_Var1;
  PFNGLUNIFORM2IVPROC p_Var2;
  PFNGLUNIFORM3FVPROC p_Var3;
  PFNGLUNIFORM4FVPROC p_Var4;
  PFNGLUNIFORMMATRIX4FVPROC p_Var5;
  GLint GVar6;
  socklen_t __len;
  mat4 *pmVar7;
  sockaddr *__addr;
  int __fd;
  allocator<char> local_211;
  RenderTexture *local_210;
  vec3 *local_208;
  mat4 *local_200;
  mat4 *local_1f8;
  mat<4,_4,_float,_(glm::qualifier)0> local_1f0;
  GLchar *local_1b0 [4];
  GLchar *local_190 [4];
  GLchar *local_170 [4];
  GLchar *local_150 [4];
  GLchar *local_130 [4];
  GLchar *local_110 [4];
  GLchar *local_f0 [4];
  GLchar *local_d0 [4];
  GLchar *local_b0 [4];
  GLchar *local_90 [4];
  GLchar *local_70 [4];
  GLchar *local_50 [4];
  
  gfx::Program::use(&this->ssf_spheres_program);
  set_common_uniforms(this,&this->ssf_spheres_program);
  p_Var5 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"projection",(allocator<char> *)&local_1f0);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,local_50[0]);
  (*p_Var5)(GVar6,1,'\0',(GLfloat *)projection);
  std::__cxx11::string::~string((string *)local_50);
  p_Var5 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"view",(allocator<char> *)&local_1f0);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,local_70[0]);
  pmVar7 = view;
  (*p_Var5)(GVar6,1,'\0',(GLfloat *)view);
  __len = (socklen_t)pmVar7;
  std::__cxx11::string::~string((string *)local_70);
  p_Var4 = glad_glUniform4fv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"viewport",(allocator<char> *)&local_1f0);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,local_90[0]);
  (*p_Var4)(GVar6,1,(GLfloat *)viewport);
  std::__cxx11::string::~string((string *)local_90);
  p_Var3 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"look",(allocator<char> *)&local_1f0);
  local_210 = scene_texture;
  local_200 = view;
  local_1f8 = projection;
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,local_b0[0]);
  local_208 = &this->look;
  __fd = 1;
  (*p_Var3)(GVar6,1,(GLfloat *)local_208);
  std::__cxx11::string::~string((string *)local_b0);
  gfx::VAO::bind(&this->vao,__fd,__addr,__len);
  (*glad_glBindFramebuffer)(0x8d40,(this->ssf_a_texture).fbo_id);
  (*glad_glDrawBuffers)(2,draw_particles_ssf::ssf_draw_buffers);
  (*glad_glClearColor)(0.0,0.0,0.0,0.0);
  (*glad_glClear)(0x4100);
  (*glad_glEnable)(0xbe2);
  (*glad_glDisable)(0xb71);
  (*glad_glBlendFunc)(1,1);
  p_Var1 = glad_glUniform1i;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"pass",(allocator<char> *)&local_1f0);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,local_d0[0]);
  (*p_Var1)(GVar6,0);
  std::__cxx11::string::~string((string *)local_d0);
  (*glad_glDrawBuffers)(2,draw_particles_ssf::first_pass_buffers);
  (*glad_glDrawArraysInstanced)(6,0,this->num_circle_vertices,(this->particle_ssbo)._length);
  (*glad_glDisable)(0xbe2);
  (*glad_glEnable)(0xb71);
  p_Var1 = glad_glUniform1i;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f0,"pass",(allocator<char> *)&local_1f0);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,local_f0[0]);
  (*p_Var1)(GVar6,1);
  std::__cxx11::string::~string((string *)local_f0);
  (*glad_glDrawBuffers)(2,draw_particles_ssf::second_pass_buffers);
  (*glad_glDrawArraysInstanced)(6,0,this->num_circle_vertices,(this->particle_ssbo)._length);
  (*glad_glBindFramebuffer)(0x8d40,0);
  gfx::VAO::unbind(&this->vao);
  (*glad_glUseProgram)(0);
  (*glad_glDisable)(0xbe2);
  gfx::Program::use(&this->ssf_smooth_program);
  p_Var2 = glad_glUniform2iv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_110,"resolution",(allocator<char> *)&local_1f0);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_smooth_program).id,local_110[0]);
  (*p_Var2)(GVar6,1,(GLint *)&this->resolution);
  std::__cxx11::string::~string((string *)local_110);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,(this->ssf_a_texture).color1_id);
  (*glad_glBindFramebuffer)(0x8d40,(this->ssf_b_texture).fbo_id);
  (*glad_glDrawBuffers)(2,draw_particles_ssf::ssf_draw_buffers);
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  (*glad_glClear)(0x4100);
  Quad::draw(&this->quad);
  (*glad_glBindFramebuffer)(0x8d40,0);
  (*glad_glBindTexture)(0xde1,0);
  (*glad_glUseProgram)(0);
  gfx::Program::use(&this->ssf_shade_program);
  p_Var2 = glad_glUniform2iv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,"resolution",(allocator<char> *)&local_1f0);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_shade_program).id,local_130[0]);
  (*p_Var2)(GVar6,1,(GLint *)&this->resolution);
  std::__cxx11::string::~string((string *)local_130);
  p_Var5 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_150,"projection",(allocator<char> *)&local_1f0);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_shade_program).id,local_150[0]);
  (*p_Var5)(GVar6,1,'\0',(GLfloat *)local_1f8);
  std::__cxx11::string::~string((string *)local_150);
  p_Var5 = glad_glUniformMatrix4fv;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_170,"inv_view",&local_211);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_shade_program).id,local_170[0]);
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_1f0,local_200);
  (*p_Var5)(GVar6,1,'\0',(GLfloat *)&local_1f0);
  std::__cxx11::string::~string((string *)local_170);
  p_Var3 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_190,"look",(allocator<char> *)&local_1f0);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_shade_program).id,local_190[0]);
  (*p_Var3)(GVar6,1,(GLfloat *)local_208);
  std::__cxx11::string::~string((string *)local_190);
  p_Var3 = glad_glUniform3fv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"eye",(allocator<char> *)&local_1f0);
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_shade_program).id,local_1b0[0]);
  (*p_Var3)(GVar6,1,(GLfloat *)&this->eye);
  std::__cxx11::string::~string((string *)local_1b0);
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,(this->ssf_a_texture).color_id);
  (*glad_glActiveTexture)(0x84c1);
  (*glad_glBindTexture)(0xde1,(this->ssf_a_texture).depth_id);
  (*glad_glActiveTexture)(0x84c2);
  (*glad_glBindTexture)(0xde1,(this->ssf_b_texture).color1_id);
  (*glad_glActiveTexture)(0x84c3);
  (*glad_glBindTexture)(0xde1,local_210->color_id);
  Quad::draw(&this->quad);
  (*glad_glBindTexture)(0xde1,0);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void draw_particles_ssf(const gfx::RenderTexture& scene_texture, const glm::mat4& projection, const glm::mat4& view, const glm::vec4& viewport) {
        constexpr static GLenum ssf_draw_buffers[]{GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1};

        // render spheres and position data
        ssf_spheres_program.use();
            set_common_uniforms(ssf_spheres_program);
            glUniformMatrix4fv(ssf_spheres_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
            glUniformMatrix4fv(ssf_spheres_program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
            glUniform4fv(ssf_spheres_program.uniform_loc("viewport"), 1, glm::value_ptr(viewport));
            glUniform3fv(ssf_spheres_program.uniform_loc("look"), 1, glm::value_ptr(look));

            vao.bind();
            ssf_a_texture.bind_framebuffer();

            // clear buffers
            glDrawBuffers(2, ssf_draw_buffers);
            glClearColor(0, 0, 0, 0);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

            // color pass
            glEnable(GL_BLEND);
            glDisable(GL_DEPTH_TEST);
            glBlendFunc(GL_ONE, GL_ONE);
            glUniform1i(ssf_spheres_program.uniform_loc("pass"), 0);
            constexpr static GLenum first_pass_buffers[]{GL_COLOR_ATTACHMENT0, GL_NONE};
            glDrawBuffers(2, first_pass_buffers);
            glDrawArraysInstanced(GL_TRIANGLE_FAN, 0, num_circle_vertices, particle_ssbo.length());

            // sphere position pass
            glDisable(GL_BLEND);
            glEnable(GL_DEPTH_TEST);
            glUniform1i(ssf_spheres_program.uniform_loc("pass"), 1);
            constexpr static GLenum second_pass_buffers[]{GL_NONE, GL_COLOR_ATTACHMENT1};
            glDrawBuffers(2, second_pass_buffers);
            glDrawArraysInstanced(GL_TRIANGLE_FAN, 0, num_circle_vertices, particle_ssbo.length());
            
            ssf_a_texture.unbind_framebuffer();
            vao.unbind();
        ssf_spheres_program.disuse();

        // smooth sphere depths, do color thing
        glDisable(GL_BLEND);
        ssf_smooth_program.use();
            glUniform2iv(ssf_smooth_program.uniform_loc("resolution"), 1, glm::value_ptr(resolution));
            glActiveTexture(GL_TEXTURE0);
            glBindTexture(GL_TEXTURE_2D, ssf_a_texture.color1_id);
            ssf_b_texture.bind_framebuffer();
            glDrawBuffers(2, ssf_draw_buffers);
            glClearColor(0, 0, 0, 1);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            quad.draw();
            ssf_b_texture.unbind_framebuffer();
            glBindTexture(GL_TEXTURE_2D, 0);
        ssf_smooth_program.disuse();

        // shade fluid
        // glDisable(GL_DEPTH_TEST);
        ssf_shade_program.use();
            glUniform2iv(ssf_shade_program.uniform_loc("resolution"), 1, glm::value_ptr(resolution));
            glUniformMatrix4fv(ssf_shade_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
            glUniformMatrix4fv(ssf_shade_program.uniform_loc("inv_view"), 1, GL_FALSE, glm::value_ptr(glm::inverse(view)));
            glUniform3fv(ssf_shade_program.uniform_loc("look"), 1, glm::value_ptr(look));
            glUniform3fv(ssf_shade_program.uniform_loc("eye"), 1, glm::value_ptr(eye));
            glActiveTexture(GL_TEXTURE0);
            glBindTexture(GL_TEXTURE_2D, ssf_a_texture.color_id);
            glActiveTexture(GL_TEXTURE1);
            glBindTexture(GL_TEXTURE_2D, ssf_a_texture.depth_id);
            glActiveTexture(GL_TEXTURE2);
            glBindTexture(GL_TEXTURE_2D, ssf_b_texture.color1_id); // sphere position data
            glActiveTexture(GL_TEXTURE3);
            glBindTexture(GL_TEXTURE_2D, scene_texture.color_id);
            quad.draw();
            glBindTexture(GL_TEXTURE_2D, 0);
        ssf_shade_program.disuse();
    }